

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_SanityCheckPass.h
# Opt level: O3

void __thiscall
soul::SanityCheckPass::PostResolutionChecks::visit
          (PostResolutionChecks *this,QualifiedIdentifier *qi)

{
  CompileMessage local_a0;
  IdentifierPath local_68;
  
  IdentifierPath::operator+
            (&local_68,&qi->pathPrefix,
             &((qi->pathSections).
               super__Vector_base<soul::AST::QualifiedIdentifier::PathSection,_std::allocator<soul::AST::QualifiedIdentifier::PathSection>_>
               ._M_impl.super__Vector_impl_data._M_start)->path);
  CompileMessageHelpers::createMessage<soul::IdentifierPath>
            (&local_a0,syntax,error,"Cannot find symbol $Q0$",&local_68);
  AST::Context::throwError
            (&(qi->super_Expression).super_Statement.super_ASTObject.context,&local_a0,false);
}

Assistant:

void visit (AST::QualifiedIdentifier& qi) override
        {
            super::visit (qi);
            qi.context.throwError (Errors::unresolvedSymbol (qi.getPath()));
        }